

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O0

bool webrtc::CheckWavParameters
               (size_t num_channels,int sample_rate,WavFormat format,size_t bytes_per_sample,
               size_t num_samples)

{
  unsigned_short uVar1;
  uint uVar2;
  size_t max_samples;
  size_t header_size;
  size_t num_samples_local;
  size_t bytes_per_sample_local;
  WavFormat format_local;
  int sample_rate_local;
  size_t num_channels_local;
  
  if (((num_channels == 0) || (sample_rate < 1)) || (bytes_per_sample == 0)) {
    num_channels_local._7_1_ = false;
  }
  else {
    uVar2 = std::numeric_limits<unsigned_int>::max();
    if ((ulong)uVar2 < (ulong)(long)sample_rate) {
      num_channels_local._7_1_ = false;
    }
    else {
      uVar1 = std::numeric_limits<unsigned_short>::max();
      if (uVar1 < num_channels) {
        num_channels_local._7_1_ = false;
      }
      else {
        uVar1 = std::numeric_limits<unsigned_short>::max();
        if ((ulong)uVar1 < bytes_per_sample << 3) {
          num_channels_local._7_1_ = false;
        }
        else {
          uVar2 = std::numeric_limits<unsigned_int>::max();
          if ((ulong)uVar2 < (long)sample_rate * num_channels * bytes_per_sample) {
            num_channels_local._7_1_ = false;
          }
          else {
            if (format == kWavFormatPcm) {
              if ((bytes_per_sample != 1) && (bytes_per_sample != 2)) {
                return false;
              }
            }
            else {
              if (1 < format - kWavFormatALaw) {
                return false;
              }
              if (bytes_per_sample != 1) {
                return false;
              }
            }
            uVar2 = std::numeric_limits<unsigned_int>::max();
            if (((ulong)uVar2 - 0x24) / bytes_per_sample < num_samples) {
              num_channels_local._7_1_ = false;
            }
            else if (num_samples % num_channels == 0) {
              num_channels_local._7_1_ = true;
            }
            else {
              num_channels_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return num_channels_local._7_1_;
}

Assistant:

bool CheckWavParameters(size_t num_channels,
                        int sample_rate,
                        WavFormat format,
                        size_t bytes_per_sample,
                        size_t num_samples) {
  // num_channels, sample_rate, and bytes_per_sample must be positive, must fit
  // in their respective fields, and their product must fit in the 32-bit
  // ByteRate field.
  if (num_channels == 0 || sample_rate <= 0 || bytes_per_sample == 0)
    return false;
  if (static_cast<uint64_t>(sample_rate) > std::numeric_limits<uint32_t>::max())
    return false;
  if (num_channels > std::numeric_limits<uint16_t>::max())
    return false;
  if (static_cast<uint64_t>(bytes_per_sample) * 8 >
      std::numeric_limits<uint16_t>::max())
    return false;
  if (static_cast<uint64_t>(sample_rate) * num_channels * bytes_per_sample >
      std::numeric_limits<uint32_t>::max())
    return false;

  // format and bytes_per_sample must agree.
  switch (format) {
    case kWavFormatPcm:
      // Other values may be OK, but for now we're conservative:
      if (bytes_per_sample != 1 && bytes_per_sample != 2)
        return false;
      break;
    case kWavFormatALaw:
    case kWavFormatMuLaw:
      if (bytes_per_sample != 1)
        return false;
      break;
    default:
      return false;
  }

  // The number of bytes in the file, not counting the first ChunkHeader, must
  // be less than 2^32; otherwise, the ChunkSize field overflows.
  const size_t header_size = kWavHeaderSize - sizeof(ChunkHeader);
  const size_t max_samples =
      (std::numeric_limits<uint32_t>::max() - header_size) / bytes_per_sample;
  if (num_samples > max_samples)
    return false;

  // Each channel must have the same number of samples.
  if (num_samples % num_channels != 0)
    return false;

  return true;
}